

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_gather.cpp
# Opt level: O1

void duckdb::RowOperations::HeapGather
               (Vector *v,idx_t *vcount,SelectionVector *sel,data_ptr_t *key_locations,
               optional_ptr<duckdb::NestedValidity,_true> parent_validity)

{
  PhysicalType PVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  pointer ppVar5;
  pointer ppVar6;
  byte bVar7;
  undefined8 uVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  bool bVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  child_list_t<LogicalType> *pcVar13;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference this_01;
  type v_00;
  NotImplementedException *this_02;
  data_ptr_t *ppdVar14;
  idx_t iVar15;
  idx_t i;
  idx_t iVar16;
  idx_t iVar17;
  uint *__src;
  ulong __n;
  size_type child_vector_index;
  string_t sVar18;
  NestedValidity parent_validity_1;
  data_ptr_t struct_validitymask_locations [2048];
  optional_ptr<duckdb::NestedValidity,_true> local_4070;
  idx_t local_4068;
  idx_t local_4060 [5];
  string local_4038 [512];
  
  ppdVar14 = key_locations;
  local_4070.ptr = parent_validity.ptr;
  Vector::SetVectorType(v,FLAT_VECTOR);
  FlatVector::VerifyFlatVector(v);
  if ((local_4070.ptr != (NestedValidity *)0x0) && (*vcount != 0)) {
    iVar16 = 0;
    do {
      optional_ptr<duckdb::NestedValidity,_true>::CheckValid(&local_4070);
      bVar11 = NestedValidity::IsValid(local_4070.ptr,iVar16);
      ppdVar14 = (data_ptr_t *)sel->sel_vector;
      iVar15 = iVar16;
      if (ppdVar14 != (data_ptr_t *)0x0) {
        iVar15 = (idx_t)*(uint *)((long)ppdVar14 + iVar16 * 4);
      }
      puVar2 = (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (bVar11) {
        if (puVar2 != (unsigned_long *)0x0) {
          ppdVar14 = (data_ptr_t *)(iVar15 & 0xffffffff);
          puVar2[iVar15 >> 6] = puVar2[iVar15 >> 6] | 1L << ((byte)ppdVar14 & 0x3f);
        }
      }
      else {
        if (puVar2 == (unsigned_long *)0x0) {
          local_4060[0] = (v->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_4038,local_4060);
          peVar9 = (element_type *)
                   CONCAT44(local_4038[0]._M_dataplus._M_p._4_4_,
                            (uint)local_4038[0]._M_dataplus._M_p);
          p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    CONCAT44(local_4038[0]._M_string_length._4_4_,
                             (undefined4)local_4038[0]._M_string_length);
          local_4038[0]._M_dataplus._M_p._0_4_ = 0;
          local_4038[0]._M_dataplus._M_p._4_4_ = 0;
          local_4038[0]._M_string_length._0_4_ = 0;
          local_4038[0]._M_string_length._4_4_ = 0;
          this = (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar9;
          (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var10;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_4038[0]._M_string_length._4_4_,
                       (undefined4)local_4038[0]._M_string_length) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(local_4038[0]._M_string_length._4_4_,
                                (undefined4)local_4038[0]._M_string_length));
          }
          pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(v->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar12->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar7 = (byte)iVar15 & 0x3f;
        ppdVar14 = (data_ptr_t *)
                   (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        ppdVar14[iVar15 >> 6] =
             (data_ptr_t)
             ((ulong)ppdVar14[iVar15 >> 6] & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7));
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 < *vcount);
  }
  PVar1 = (v->type).physical_type_;
  if (PVar1 < VARCHAR) {
    switch(PVar1) {
    case BOOL:
    case INT8:
      iVar16 = *vcount;
      if (iVar16 != 0) {
        pdVar3 = v->data;
        iVar15 = 0;
        do {
          iVar17 = iVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar17 = (idx_t)sel->sel_vector[iVar15];
          }
          pdVar3[iVar17] = *key_locations[iVar15];
          key_locations[iVar15] = key_locations[iVar15] + 1;
          iVar15 = iVar15 + 1;
        } while (iVar16 != iVar15);
      }
      break;
    case UINT8:
      iVar16 = *vcount;
      if (iVar16 != 0) {
        pdVar3 = v->data;
        iVar15 = 0;
        do {
          iVar17 = iVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar17 = (idx_t)sel->sel_vector[iVar15];
          }
          pdVar3[iVar17] = *key_locations[iVar15];
          key_locations[iVar15] = key_locations[iVar15] + 1;
          iVar15 = iVar15 + 1;
        } while (iVar16 != iVar15);
      }
      break;
    case UINT16:
      iVar16 = *vcount;
      if (iVar16 != 0) {
        pdVar3 = v->data;
        iVar15 = 0;
        do {
          iVar17 = iVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar17 = (idx_t)sel->sel_vector[iVar15];
          }
          pdVar4 = key_locations[iVar15];
          *(undefined2 *)(pdVar3 + iVar17 * 2) = *(undefined2 *)pdVar4;
          key_locations[iVar15] = pdVar4 + 2;
          iVar15 = iVar15 + 1;
        } while (iVar16 != iVar15);
      }
      break;
    case INT16:
      iVar16 = *vcount;
      if (iVar16 != 0) {
        pdVar3 = v->data;
        iVar15 = 0;
        do {
          iVar17 = iVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar17 = (idx_t)sel->sel_vector[iVar15];
          }
          pdVar4 = key_locations[iVar15];
          *(undefined2 *)(pdVar3 + iVar17 * 2) = *(undefined2 *)pdVar4;
          key_locations[iVar15] = pdVar4 + 2;
          iVar15 = iVar15 + 1;
        } while (iVar16 != iVar15);
      }
      break;
    case UINT32:
      iVar16 = *vcount;
      if (iVar16 != 0) {
        pdVar3 = v->data;
        iVar15 = 0;
        do {
          iVar17 = iVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar17 = (idx_t)sel->sel_vector[iVar15];
          }
          pdVar4 = key_locations[iVar15];
          *(undefined4 *)(pdVar3 + iVar17 * 4) = *(undefined4 *)pdVar4;
          key_locations[iVar15] = pdVar4 + 4;
          iVar15 = iVar15 + 1;
        } while (iVar16 != iVar15);
      }
      break;
    case INT32:
      iVar16 = *vcount;
      if (iVar16 != 0) {
        pdVar3 = v->data;
        iVar15 = 0;
        do {
          iVar17 = iVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar17 = (idx_t)sel->sel_vector[iVar15];
          }
          pdVar4 = key_locations[iVar15];
          *(undefined4 *)(pdVar3 + iVar17 * 4) = *(undefined4 *)pdVar4;
          key_locations[iVar15] = pdVar4 + 4;
          iVar15 = iVar15 + 1;
        } while (iVar16 != iVar15);
      }
      break;
    case UINT64:
      iVar16 = *vcount;
      if (iVar16 != 0) {
        pdVar3 = v->data;
        iVar15 = 0;
        do {
          iVar17 = iVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar17 = (idx_t)sel->sel_vector[iVar15];
          }
          pdVar4 = key_locations[iVar15];
          *(undefined8 *)(pdVar3 + iVar17 * 8) = *(undefined8 *)pdVar4;
          key_locations[iVar15] = pdVar4 + 8;
          iVar15 = iVar15 + 1;
        } while (iVar16 != iVar15);
      }
      break;
    case INT64:
      iVar16 = *vcount;
      if (iVar16 != 0) {
        pdVar3 = v->data;
        iVar15 = 0;
        do {
          iVar17 = iVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar17 = (idx_t)sel->sel_vector[iVar15];
          }
          pdVar4 = key_locations[iVar15];
          *(undefined8 *)(pdVar3 + iVar17 * 8) = *(undefined8 *)pdVar4;
          key_locations[iVar15] = pdVar4 + 8;
          iVar15 = iVar15 + 1;
        } while (iVar16 != iVar15);
      }
      break;
    default:
switchD_015d09ef_caseD_a:
      this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_4038[0]._M_dataplus._M_p = (pointer)&local_4038[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4038,"Unimplemented deserialize from row-format","");
      NotImplementedException::NotImplementedException(this_02,local_4038);
      __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      iVar16 = *vcount;
      if (iVar16 != 0) {
        pdVar3 = v->data;
        iVar15 = 0;
        do {
          iVar17 = iVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar17 = (idx_t)sel->sel_vector[iVar15];
          }
          pdVar4 = key_locations[iVar15];
          *(undefined4 *)(pdVar3 + iVar17 * 4) = *(undefined4 *)pdVar4;
          key_locations[iVar15] = pdVar4 + 4;
          iVar15 = iVar15 + 1;
        } while (iVar16 != iVar15);
      }
      break;
    case DOUBLE:
      iVar16 = *vcount;
      if (iVar16 != 0) {
        pdVar3 = v->data;
        iVar15 = 0;
        do {
          iVar17 = iVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar17 = (idx_t)sel->sel_vector[iVar15];
          }
          pdVar4 = key_locations[iVar15];
          *(undefined8 *)(pdVar3 + iVar17 * 8) = *(undefined8 *)pdVar4;
          key_locations[iVar15] = pdVar4 + 8;
          iVar15 = iVar15 + 1;
        } while (iVar16 != iVar15);
      }
      break;
    case INTERVAL:
      iVar16 = *vcount;
      if (iVar16 != 0) {
        pdVar3 = v->data;
        iVar15 = 0;
        do {
          iVar17 = iVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar17 = (idx_t)sel->sel_vector[iVar15];
          }
          uVar8 = *(undefined8 *)(key_locations[iVar15] + 8);
          *(undefined8 *)(pdVar3 + iVar17 * 0x10) = *(undefined8 *)key_locations[iVar15];
          *(undefined8 *)(pdVar3 + iVar17 * 0x10 + 8) = uVar8;
          key_locations[iVar15] = key_locations[iVar15] + 0x10;
          iVar15 = iVar15 + 1;
        } while (iVar16 != iVar15);
      }
      break;
    case LIST:
      HeapGatherListVector(v,*vcount,sel,key_locations);
      break;
    case STRUCT:
      iVar16 = *vcount;
      local_4068 = iVar16;
      pcVar13 = StructType::GetChildTypes_abi_cxx11_(&v->type);
      if (iVar16 != 0) {
        ppVar5 = (pcVar13->
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar6 = (pcVar13->
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar15 = 0;
        do {
          pdVar3 = key_locations[iVar15];
          (&local_4038[0]._M_dataplus)[iVar15]._M_p = (pointer)pdVar3;
          key_locations[iVar15] =
               pdVar3 + (((long)ppVar5 - (long)ppVar6 >> 3) * 0x6db6db6db6db6db7 + 7U >> 3);
          iVar15 = iVar15 + 1;
        } while (iVar16 != iVar15);
      }
      this_00 = StructVector::GetEntries(v);
      if ((pcVar13->
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pcVar13->
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        child_vector_index = 0;
        do {
          NestedValidity::NestedValidity
                    ((NestedValidity *)local_4060,(data_ptr_t *)local_4038,child_vector_index);
          this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this_00,child_vector_index);
          v_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (this_01);
          HeapGather(v_00,&local_4068,sel,key_locations,(NestedValidity *)local_4060);
          child_vector_index = child_vector_index + 1;
        } while (child_vector_index <
                 (ulong)(((long)(pcVar13->
                                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                ).
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pcVar13->
                                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                ).
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7
                        ));
      }
      break;
    case ARRAY:
      HeapGatherArrayVector(v,*vcount,sel,key_locations);
    }
  }
  else if (PVar1 == VARCHAR) {
    iVar16 = *vcount;
    FlatVector::VerifyFlatVector(v);
    if (iVar16 != 0) {
      pdVar3 = v->data;
      iVar15 = 0;
      do {
        iVar17 = iVar15;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar17 = (idx_t)sel->sel_vector[iVar15];
        }
        puVar2 = (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar2 == (unsigned_long *)0x0) ||
           (ppdVar14 = (data_ptr_t *)(iVar17 >> 6),
           (puVar2[(long)ppdVar14] >> (iVar17 & 0x3f) & 1) != 0)) {
          local_4038[0]._M_dataplus._M_p._0_4_ = *(uint *)key_locations[iVar15];
          __n = (ulong)(uint)local_4038[0]._M_dataplus._M_p;
          __src = (uint *)((long)key_locations[iVar15] + 4);
          key_locations[iVar15] = (data_ptr_t)__src;
          if (__n < 0xd) {
            local_4038[0]._M_string_length._4_4_ = 0;
            local_4038[0]._M_dataplus._M_p._4_4_ = 0;
            local_4038[0]._M_string_length._0_4_ = 0;
            local_4038[0]._M_string_length = (size_type)(uint *)0x0;
            if (__n != 0) {
              switchD_01602a8a::default
                        ((void *)((long)&local_4038[0]._M_dataplus._M_p + 4),__src,__n);
              local_4038[0]._M_string_length =
                   (size_type)
                   CONCAT44(local_4038[0]._M_string_length._4_4_,
                            (undefined4)local_4038[0]._M_string_length);
            }
          }
          else {
            local_4038[0]._M_dataplus._M_p._4_4_ = *__src;
            local_4038[0]._M_string_length = (size_type)__src;
          }
          sVar18.value.pointer.ptr = (char *)ppdVar14;
          sVar18.value._0_8_ = local_4038[0]._M_string_length;
          sVar18 = StringVector::AddStringOrBlob
                             ((StringVector *)v,
                              (Vector *)
                              CONCAT44(local_4038[0]._M_dataplus._M_p._4_4_,
                                       (uint)local_4038[0]._M_dataplus._M_p),sVar18);
          *(long *)(pdVar3 + iVar17 * 0x10) = sVar18.value._0_8_;
          *(long *)(pdVar3 + iVar17 * 0x10 + 8) = sVar18.value._8_8_;
          key_locations[iVar15] = key_locations[iVar15] + __n;
        }
        iVar15 = iVar15 + 1;
      } while (iVar16 != iVar15);
    }
  }
  else if (PVar1 == UINT128) {
    iVar16 = *vcount;
    if (iVar16 != 0) {
      pdVar3 = v->data;
      iVar15 = 0;
      do {
        iVar17 = iVar15;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar17 = (idx_t)sel->sel_vector[iVar15];
        }
        pdVar4 = key_locations[iVar15];
        uVar8 = *(undefined8 *)(pdVar4 + 8);
        *(undefined8 *)(pdVar3 + iVar17 * 0x10) = *(undefined8 *)pdVar4;
        *(undefined8 *)(pdVar3 + iVar17 * 0x10 + 8) = uVar8;
        key_locations[iVar15] = pdVar4 + 0x10;
        iVar15 = iVar15 + 1;
      } while (iVar16 != iVar15);
    }
  }
  else {
    if (PVar1 != INT128) goto switchD_015d09ef_caseD_a;
    iVar16 = *vcount;
    if (iVar16 != 0) {
      pdVar3 = v->data;
      iVar15 = 0;
      do {
        iVar17 = iVar15;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar17 = (idx_t)sel->sel_vector[iVar15];
        }
        pdVar4 = key_locations[iVar15];
        uVar8 = *(undefined8 *)(pdVar4 + 8);
        *(undefined8 *)(pdVar3 + iVar17 * 0x10) = *(undefined8 *)pdVar4;
        *(undefined8 *)(pdVar3 + iVar17 * 0x10 + 8) = uVar8;
        key_locations[iVar15] = pdVar4 + 0x10;
        iVar15 = iVar15 + 1;
      } while (iVar16 != iVar15);
    }
  }
  return;
}

Assistant:

void RowOperations::HeapGather(Vector &v, const idx_t &vcount, const SelectionVector &sel, data_ptr_t *key_locations,
                               optional_ptr<NestedValidity> parent_validity) {
	v.SetVectorType(VectorType::FLAT_VECTOR);

	auto &validity = FlatVector::Validity(v);
	if (parent_validity) {
		for (idx_t i = 0; i < vcount; i++) {
			const auto valid = parent_validity->IsValid(i);
			const auto col_idx = sel.get_index(i);
			validity.Set(col_idx, valid);
		}
	}

	auto type = v.GetType().InternalType();
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedHeapGather<int8_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INT16:
		TemplatedHeapGather<int16_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INT32:
		TemplatedHeapGather<int32_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INT64:
		TemplatedHeapGather<int64_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT8:
		TemplatedHeapGather<uint8_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT16:
		TemplatedHeapGather<uint16_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT32:
		TemplatedHeapGather<uint32_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT64:
		TemplatedHeapGather<uint64_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INT128:
		TemplatedHeapGather<hugeint_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT128:
		TemplatedHeapGather<uhugeint_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::FLOAT:
		TemplatedHeapGather<float>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::DOUBLE:
		TemplatedHeapGather<double>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INTERVAL:
		TemplatedHeapGather<interval_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::VARCHAR:
		HeapGatherStringVector(v, vcount, sel, key_locations);
		break;
	case PhysicalType::STRUCT:
		HeapGatherStructVector(v, vcount, sel, key_locations);
		break;
	case PhysicalType::LIST:
		HeapGatherListVector(v, vcount, sel, key_locations);
		break;
	case PhysicalType::ARRAY:
		HeapGatherArrayVector(v, vcount, sel, key_locations);
		break;
	default:
		throw NotImplementedException("Unimplemented deserialize from row-format");
	}
}